

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potions.cpp
# Opt level: O3

int turn_see(int turn_off)

{
  MonsterThing *mp;
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int y;
  int x;
  _List_node_base *p_Var5;
  
  if (mlist_abi_cxx11_.super__List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_>._M_impl.
      _M_node.super__List_node_base._M_next == (_List_node_base *)&mlist_abi_cxx11_) {
    uVar4 = 0;
  }
  else {
    bVar2 = 0;
    p_Var5 = mlist_abi_cxx11_.super__List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    do {
      mp = (MonsterThing *)p_Var5[1]._M_next;
      bVar1 = see_monst(mp);
      if (turn_off == 0) {
        x = (mp->pos).x;
        y = (mp->pos).y;
        if (bVar1) {
          if (((uint)player.flags >> 0xb & 1) == 0) {
            iVar3 = (int)mp->type;
          }
          else {
            iVar3 = rnd(0x1a);
            iVar3 = iVar3 + 0x41;
          }
          goto LAB_00121ff0;
        }
        if (((uint)player.flags >> 0xb & 1) == 0) {
          uVar4 = (uint)mp->type;
        }
        else {
          iVar3 = rnd(0x1a);
          uVar4 = iVar3 + 0x41;
        }
        setMapDisplay(x,y,uVar4 | 0x100);
        bVar2 = 1;
      }
      else if (!bVar1) {
        x = (mp->pos).x;
        y = (mp->pos).y;
        iVar3 = (int)places[x * 0x20 + y].p_ch;
LAB_00121ff0:
        setMapDisplay(x,y,iVar3);
      }
      p_Var5 = (((_List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)&p_Var5->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var5 != (_List_node_base *)&mlist_abi_cxx11_);
    uVar4 = (uint)bVar2;
  }
  player.flags = (uint)(turn_off == 0) << 0xe | player.flags & 0xffffbfffU;
  return uVar4;
}

Assistant:

int turn_see(int turn_off)
{
    bool can_see, add_new;

    add_new = false;
    for (MonsterThing* mp : mlist)
    {
        can_see = see_monst(mp);
        if (turn_off)
        {
            if (!can_see)
                setMapDisplay(mp->pos.x, mp->pos.y, char_at(mp->pos.x, mp->pos.y));
        }
        else
        {
            if (!can_see)
            {
                if (!on(player, ISHALU))
                    setMapDisplay(mp->pos.x, mp->pos.y, mp->type | DISPLAY_INVERT);
                else
                    setMapDisplay(mp->pos.x, mp->pos.y, (rnd(26) + 'A')  | DISPLAY_INVERT);
                add_new++;
            }else{
                if (!on(player, ISHALU))
                    setMapDisplay(mp->pos.x, mp->pos.y, mp->type);
                else
                    setMapDisplay(mp->pos.x, mp->pos.y, rnd(26) + 'A');
            }
        }
    }
    if (turn_off)
        player.flags &= ~SEEMONST;
    else
        player.flags |= SEEMONST;
    return add_new;
}